

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

int __thiscall
CVmObjTimeZone::getp_getLocation(CVmObjTimeZone *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  vm_tzobj_ext *pvVar3;
  char *__s;
  CVmNativeCodeDesc *__s_00;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjTimeZone *in_RDI;
  char *p;
  char *str;
  vm_val_t ele;
  CVmObjList *lst;
  CVmTimeZone *tz;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff58;
  CVmObjList *in_stack_ffffffffffffff60;
  uint7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar4;
  vm_val_t *this_00;
  int local_7c;
  CVmObjList *local_70;
  vm_val_t local_60;
  CVmObject *local_50;
  CVmTimeZone *local_48;
  int local_2c;
  vm_val_t *local_20;
  
  if (in_RCX == (int *)0x0) {
    local_7c = 0;
  }
  else {
    local_7c = *in_RCX;
  }
  local_2c = local_7c;
  local_20 = in_RDX;
  if ((getp_getLocation(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getLocation(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getLocation::desc,0);
    __cxa_guard_release(&getp_getLocation(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                     (uint *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (iVar1 == 0) {
    pvVar3 = get_ext(in_RDI);
    local_48 = pvVar3->tz;
    this_00 = local_20;
    vVar2 = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                               (size_t)in_stack_ffffffffffffff58);
    vm_val_t::set_obj(this_00,vVar2);
    iVar1 = (int)((ulong)this_00 >> 0x20);
    local_50 = vm_objp(0);
    CVmStack::push(local_20);
    CVmObjList::cons_clear(in_stack_ffffffffffffff60);
    __s = CVmTimeZone::country(local_48);
    strlen(__s);
    vVar2 = CVmObjString::create
                      (iVar1,(char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       (size_t)in_stack_ffffffffffffff60);
    vm_val_t::set_obj(&local_60,vVar2);
    CVmObjList::cons_set_element
              (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,(vm_val_t *)0x2f77f8);
    local_70 = (CVmObjList *)CVmTimeZone::coords(local_48);
    if ((*(char *)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject == '+') ||
       (*(char *)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject == '-')) {
      local_70 = (CVmObjList *)
                 ((long)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 1);
    }
    while( true ) {
      uVar4 = false;
      if ((*(char *)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '\0') &&
         (uVar4 = false,
         *(char *)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '-')) {
        uVar4 = *(char *)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject != '+';
      }
      if ((bool)uVar4 == false) break;
      local_70 = (CVmObjList *)
                 ((long)&(local_70->super_CVmObjCollection).super_CVmObject._vptr_CVmObject + 1);
    }
    vVar2 = CVmObjString::create
                      (iVar1,(char *)(ulong)in_stack_ffffffffffffff68,
                       (size_t)in_stack_ffffffffffffff60);
    vm_val_t::set_obj(&local_60,vVar2);
    CVmObjList::cons_set_element
              (in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,(vm_val_t *)0x2f78c8);
    strlen((char *)local_70);
    vVar2 = CVmObjString::create
                      (iVar1,(char *)CONCAT17(uVar4,in_stack_ffffffffffffff68),(size_t)local_70);
    vm_val_t::set_obj(&local_60,vVar2);
    CVmObjList::cons_set_element(local_70,(size_t)in_stack_ffffffffffffff58,(vm_val_t *)0x2f790b);
    __s_00 = (CVmNativeCodeDesc *)CVmTimeZone::desc(local_48);
    if ((__s_00 == (CVmNativeCodeDesc *)0x0) || ((char)__s_00->min_argc_ == '\0')) {
      vm_val_t::set_nil(&local_60);
    }
    else {
      strlen((char *)__s_00);
      vVar2 = CVmObjString::create
                        (iVar1,(char *)CONCAT17(uVar4,in_stack_ffffffffffffff68),(size_t)local_70);
      vm_val_t::set_obj(&local_60,vVar2);
      in_stack_ffffffffffffff58 = __s_00;
    }
    CVmObjList::cons_set_element(local_70,(size_t)in_stack_ffffffffffffff58,(vm_val_t *)0x2f797c);
    CVmStack::discard(local_2c + 1);
  }
  return 1;
}

Assistant:

int CVmObjTimeZone::getp_getLocation(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get our underlying CVmTimeZone object */
    CVmTimeZone *tz = get_ext()->tz;

    /* create the return list - [country, lat, long, desc] */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 4));
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    G_stk->push(retval);
    lst->cons_clear();

    /* set the country string */
    vm_val_t ele;
    const char *str = tz->country();
    ele.set_obj(CVmObjString::create(vmg_ FALSE, str, strlen(str)));
    lst->cons_set_element(0, &ele);

    /* get the lat/long string */
    str = tz->coords();

    /* find the +/- that separates the lat/long portions */
    const char *p = str;
    if (*p == '+' || *p == '-')
        ++p;
    for ( ; *p != '\0' && *p != '-' && *p != '+' ; ++p) ;

    /* set the two substrings */
    ele.set_obj(CVmObjString::create(vmg_ FALSE, str, p - str));
    lst->cons_set_element(1, &ele);
    ele.set_obj(CVmObjString::create(vmg_ FALSE, p, strlen(p)));
    lst->cons_set_element(2, &ele);

    /* set the description string */
    str = tz->desc();
    if (str != 0 && str[0] != '\0')
        ele.set_obj(CVmObjString::create(vmg_ FALSE, str, strlen(str)));
    else
        ele.set_nil();
    lst->cons_set_element(3, &ele);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}